

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O2

void __thiscall
Assimp::PretransformVertices::CollectData
          (PretransformVertices *this,aiScene *pcScene,aiNode *pcNode,uint iMat,uint iVFormat,
          aiMesh *pcMeshOut,uint *aiCurrent,uint *num_refs)

{
  aiMatrix4x4 *this_00;
  uint *puVar1;
  aiVector3D *paVar2;
  aiFace *paVar3;
  aiFace *paVar4;
  aiVector3D *paVar5;
  bool bVar6;
  float fVar7;
  uint uVar8;
  PretransformVertices *this_01;
  uint *puVar9;
  aiVector3t<float> *paVar10;
  uint uVar11;
  ulong uVar12;
  uint i;
  long lVar13;
  aiMesh *pcMesh;
  ulong uVar14;
  uint n;
  ulong uVar15;
  uint n_2;
  aiVector3t<float> aVar16;
  undefined1 local_f0 [16];
  aiMesh *local_e0;
  uint local_d8;
  float local_d4;
  aiScene *local_d0;
  ulong local_c8;
  aiMatrix4x4t<float> *local_c0;
  char *local_b8;
  aiNode *local_b0;
  PretransformVertices *local_a8;
  ulong local_a0;
  aiMatrix4x4 mWorldIT;
  aiMatrix3x3t<float> local_58;
  
  this_00 = &pcNode->mTransformation;
  this_01 = (PretransformVertices *)this_00;
  local_d0 = pcScene;
  local_a8 = this;
  bVar6 = aiMatrix4x4t<float>::IsIdentity(this_00);
  local_b8 = (pcMeshOut->mName).data;
  uVar15 = 0;
  local_d8 = iMat;
  local_d4 = (float)iVFormat;
  local_c0 = this_00;
  local_b0 = pcNode;
  do {
    if (pcNode->mNumMeshes <= uVar15) {
      for (uVar15 = 0; uVar15 < pcNode->mNumChildren; uVar15 = uVar15 + 1) {
        CollectData(local_a8,local_d0,pcNode->mChildren[uVar15],iMat,iVFormat,pcMeshOut,aiCurrent,
                    num_refs);
      }
      return;
    }
    pcMesh = local_d0->mMeshes[pcNode->mMeshes[uVar15]];
    local_c8 = uVar15;
    if (pcMesh->mMaterialIndex == iMat) {
      fVar7 = (float)GetMeshVFormat(this_01,pcMesh);
      if (fVar7 == (float)iVFormat) {
        uVar15 = (ulong)pcNode->mMeshes[local_c8];
        if (num_refs[uVar15] == 0) {
          __assert_fail("0 != num_ref",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/PretransformVertices.cpp"
                        ,0x9a,
                        "void Assimp::PretransformVertices::CollectData(const aiScene *, const aiNode *, unsigned int, unsigned int, aiMesh *, unsigned int *, unsigned int *) const"
                       );
        }
        uVar8 = num_refs[uVar15] - 1;
        num_refs[uVar15] = uVar8;
        local_a0 = uVar15;
        if ((pcMesh != pcMeshOut) && (uVar8 == 0)) {
          uVar8 = (pcMesh->mName).length;
          (pcMeshOut->mName).length = uVar8;
          memcpy(local_b8,(pcMesh->mName).data,(ulong)uVar8);
          (pcMeshOut->mName).data[uVar8] = '\0';
        }
        local_e0 = pcMesh;
        if (bVar6) {
          this_01 = (PretransformVertices *)(pcMeshOut->mVertices + *aiCurrent);
          memcpy(this_01,pcMesh->mVertices,(ulong)pcMesh->mNumVertices * 0xc);
          if ((iVFormat & 2) != 0) {
            this_01 = (PretransformVertices *)(pcMeshOut->mNormals + *aiCurrent);
            memcpy(this_01,pcMesh->mNormals,(ulong)pcMesh->mNumVertices * 0xc);
          }
          if ((iVFormat & 4) != 0) {
            memcpy(pcMeshOut->mTangents + *aiCurrent,pcMesh->mTangents,
                   (ulong)pcMesh->mNumVertices * 0xc);
            this_01 = (PretransformVertices *)(pcMeshOut->mBitangents + *aiCurrent);
            memcpy(this_01,pcMesh->mBitangents,(ulong)pcMesh->mNumVertices * 0xc);
          }
        }
        else {
          lVar13 = 0;
          for (uVar15 = 0; uVar15 < pcMesh->mNumVertices; uVar15 = uVar15 + 1) {
            aVar16 = ::operator*(local_c0,(aiVector3t<float> *)
                                          ((long)&pcMesh->mVertices->x + lVar13));
            paVar2 = pcMeshOut->mVertices;
            uVar8 = *aiCurrent + (int)uVar15;
            paVar5 = paVar2 + uVar8;
            paVar5->x = (float)(int)aVar16._0_8_;
            paVar5->y = (float)(int)((ulong)aVar16._0_8_ >> 0x20);
            paVar2[uVar8].z = aVar16.z;
            lVar13 = lVar13 + 0xc;
          }
          mWorldIT.a1 = local_c0->a1;
          mWorldIT.a2 = local_c0->a2;
          mWorldIT.a3 = local_c0->a3;
          mWorldIT.a4 = local_c0->a4;
          mWorldIT.b1 = local_c0->b1;
          mWorldIT.b2 = local_c0->b2;
          mWorldIT.b3 = local_c0->b3;
          mWorldIT.b4 = local_c0->b4;
          mWorldIT.c1 = local_c0->c1;
          mWorldIT.c2 = local_c0->c2;
          mWorldIT.c3 = local_c0->c3;
          mWorldIT.c4 = local_c0->c4;
          mWorldIT.d1 = local_c0->d1;
          mWorldIT.d2 = local_c0->d2;
          mWorldIT.d3 = local_c0->d3;
          mWorldIT.d4 = local_c0->d4;
          this_01 = (PretransformVertices *)aiMatrix4x4t<float>::Inverse(&mWorldIT);
          aiMatrix4x4t<float>::Transpose((aiMatrix4x4t<float> *)this_01);
          local_58.a1 = mWorldIT.a1;
          local_58.a2 = mWorldIT.a2;
          local_58.a3 = mWorldIT.a3;
          local_58.b1 = mWorldIT.b1;
          local_58.c1 = mWorldIT.c1;
          local_58.c2 = mWorldIT.c2;
          local_58.b2 = mWorldIT.b2;
          local_58.b3 = mWorldIT.b3;
          local_58.c3 = mWorldIT.c3;
          if ((iVFormat & 2) != 0) {
            lVar13 = 0;
            for (uVar15 = 0; uVar15 < pcMesh->mNumVertices; uVar15 = uVar15 + 1) {
              aVar16 = ::operator*(&local_58,
                                   (aiVector3t<float> *)((long)&pcMesh->mNormals->x + lVar13));
              local_f0._8_4_ = aVar16.z;
              local_f0._0_8_ = aVar16._0_8_;
              this_01 = (PretransformVertices *)local_f0;
              paVar10 = aiVector3t<float>::Normalize((aiVector3t<float> *)this_01);
              paVar5 = pcMeshOut->mNormals;
              uVar8 = *aiCurrent + (int)uVar15;
              paVar5[uVar8].z = paVar10->z;
              fVar7 = paVar10->y;
              paVar5 = paVar5 + uVar8;
              paVar5->x = paVar10->x;
              paVar5->y = fVar7;
              lVar13 = lVar13 + 0xc;
            }
          }
          if ((iVFormat & 4) != 0) {
            lVar13 = 0;
            for (uVar15 = 0; uVar15 < pcMesh->mNumVertices; uVar15 = uVar15 + 1) {
              aVar16 = ::operator*(&local_58,
                                   (aiVector3t<float> *)((long)&pcMesh->mTangents->x + lVar13));
              local_f0._8_4_ = aVar16.z;
              local_f0._0_8_ = aVar16._0_8_;
              paVar10 = aiVector3t<float>::Normalize((aiVector3t<float> *)local_f0);
              pcMesh = local_e0;
              paVar5 = pcMeshOut->mTangents;
              uVar8 = *aiCurrent + (int)uVar15;
              paVar5[uVar8].z = paVar10->z;
              fVar7 = paVar10->y;
              paVar5 = paVar5 + uVar8;
              paVar5->x = paVar10->x;
              paVar5->y = fVar7;
              aVar16 = ::operator*(&local_58,
                                   (aiVector3t<float> *)((long)&local_e0->mBitangents->x + lVar13));
              local_f0._8_4_ = aVar16.z;
              local_f0._0_8_ = aVar16._0_8_;
              this_01 = (PretransformVertices *)local_f0;
              paVar10 = aiVector3t<float>::Normalize((aiVector3t<float> *)this_01);
              paVar5 = pcMeshOut->mBitangents;
              uVar8 = *aiCurrent + (int)uVar15;
              paVar5[uVar8].z = paVar10->z;
              fVar7 = paVar10->y;
              paVar5 = paVar5 + uVar8;
              paVar5->x = paVar10->x;
              paVar5->y = fVar7;
              lVar13 = lVar13 + 0xc;
            }
          }
        }
        uVar8 = 0;
        while (((iVFormat >> ((byte)uVar8 & 0x1f)) >> 8 & 1) != 0) {
          this_01 = (PretransformVertices *)(pcMeshOut->mTextureCoords[uVar8] + *aiCurrent);
          memcpy(this_01,pcMesh->mTextureCoords[uVar8],(ulong)pcMesh->mNumVertices * 0xc);
          uVar8 = uVar8 + 1;
        }
        uVar8 = 0;
        while (((iVFormat >> ((byte)uVar8 & 0x1f)) >> 0x18 & 1) != 0) {
          this_01 = (PretransformVertices *)(pcMeshOut->mColors[uVar8] + *aiCurrent);
          memcpy(this_01,pcMesh->mColors[uVar8],(ulong)pcMesh->mNumVertices << 4);
          uVar8 = uVar8 + 1;
        }
        for (uVar15 = 0; uVar15 < pcMesh->mNumFaces; uVar15 = uVar15 + 1) {
          paVar3 = pcMesh->mFaces;
          paVar4 = pcMeshOut->mFaces;
          uVar8 = aiCurrent[1] + (int)uVar15;
          uVar14 = (ulong)paVar3[uVar15].mNumIndices;
          paVar4[uVar8].mNumIndices = paVar3[uVar15].mNumIndices;
          if (num_refs[local_a0] == 0) {
            puVar9 = paVar3[uVar15].mIndices;
            paVar4[uVar8].mIndices = puVar9;
            for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
              puVar1 = puVar9 + uVar12;
              *puVar1 = *puVar1 + *aiCurrent;
            }
          }
          else {
            this_01 = (PretransformVertices *)(uVar14 * 4);
            puVar9 = (uint *)operator_new__((ulong)this_01);
            paVar4[uVar8].mIndices = puVar9;
            for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
              puVar9[uVar12] = *aiCurrent + paVar3[uVar15].mIndices[uVar12];
            }
          }
          uVar11 = local_e0->mFaces[uVar15].mNumIndices - 1;
          uVar8 = 8;
          if (uVar11 < 3) {
            uVar8 = *(uint *)(&DAT_005b9a60 + (ulong)uVar11 * 4);
          }
          pcMeshOut->mPrimitiveTypes = pcMeshOut->mPrimitiveTypes | uVar8;
          pcMesh = local_e0;
          iVFormat = (uint)local_d4;
        }
        *aiCurrent = *aiCurrent + pcMesh->mNumVertices;
        aiCurrent[1] = aiCurrent[1] + pcMesh->mNumFaces;
        pcNode = local_b0;
        iMat = local_d8;
      }
    }
    uVar15 = local_c8 + 1;
  } while( true );
}

Assistant:

void PretransformVertices::CollectData(const aiScene *pcScene, const aiNode *pcNode, unsigned int iMat,
		unsigned int iVFormat, aiMesh *pcMeshOut,
		unsigned int aiCurrent[2], unsigned int *num_refs) const {
	// No need to multiply if there's no transformation
	const bool identity = pcNode->mTransformation.IsIdentity();
	for (unsigned int i = 0; i < pcNode->mNumMeshes; ++i) {
		aiMesh *pcMesh = pcScene->mMeshes[pcNode->mMeshes[i]];
		if (iMat == pcMesh->mMaterialIndex && iVFormat == GetMeshVFormat(pcMesh)) {
			// Decrement mesh reference counter
			unsigned int &num_ref = num_refs[pcNode->mMeshes[i]];
			ai_assert(0 != num_ref);
			--num_ref;
			// Save the name of the last mesh
			if (num_ref == 0) {
				pcMeshOut->mName = pcMesh->mName;
			}

			if (identity) {
				// copy positions without modifying them
				::memcpy(pcMeshOut->mVertices + aiCurrent[AI_PTVS_VERTEX],
						pcMesh->mVertices,
						pcMesh->mNumVertices * sizeof(aiVector3D));

				if (iVFormat & 0x2) {
					// copy normals without modifying them
					::memcpy(pcMeshOut->mNormals + aiCurrent[AI_PTVS_VERTEX],
							pcMesh->mNormals,
							pcMesh->mNumVertices * sizeof(aiVector3D));
				}
				if (iVFormat & 0x4) {
					// copy tangents without modifying them
					::memcpy(pcMeshOut->mTangents + aiCurrent[AI_PTVS_VERTEX],
							pcMesh->mTangents,
							pcMesh->mNumVertices * sizeof(aiVector3D));
					// copy bitangents without modifying them
					::memcpy(pcMeshOut->mBitangents + aiCurrent[AI_PTVS_VERTEX],
							pcMesh->mBitangents,
							pcMesh->mNumVertices * sizeof(aiVector3D));
				}
			} else {
				// copy positions, transform them to worldspace
				for (unsigned int n = 0; n < pcMesh->mNumVertices; ++n) {
					pcMeshOut->mVertices[aiCurrent[AI_PTVS_VERTEX] + n] = pcNode->mTransformation * pcMesh->mVertices[n];
				}
				aiMatrix4x4 mWorldIT = pcNode->mTransformation;
				mWorldIT.Inverse().Transpose();

				// TODO: implement Inverse() for aiMatrix3x3
				aiMatrix3x3 m = aiMatrix3x3(mWorldIT);

				if (iVFormat & 0x2) {
					// copy normals, transform them to worldspace
					for (unsigned int n = 0; n < pcMesh->mNumVertices; ++n) {
						pcMeshOut->mNormals[aiCurrent[AI_PTVS_VERTEX] + n] =
								(m * pcMesh->mNormals[n]).Normalize();
					}
				}
				if (iVFormat & 0x4) {
					// copy tangents and bitangents, transform them to worldspace
					for (unsigned int n = 0; n < pcMesh->mNumVertices; ++n) {
						pcMeshOut->mTangents[aiCurrent[AI_PTVS_VERTEX] + n] = (m * pcMesh->mTangents[n]).Normalize();
						pcMeshOut->mBitangents[aiCurrent[AI_PTVS_VERTEX] + n] = (m * pcMesh->mBitangents[n]).Normalize();
					}
				}
			}
			unsigned int p = 0;
			while (iVFormat & (0x100 << p)) {
				// copy texture coordinates
				memcpy(pcMeshOut->mTextureCoords[p] + aiCurrent[AI_PTVS_VERTEX],
						pcMesh->mTextureCoords[p],
						pcMesh->mNumVertices * sizeof(aiVector3D));
				++p;
			}
			p = 0;
			while (iVFormat & (0x1000000 << p)) {
				// copy vertex colors
				memcpy(pcMeshOut->mColors[p] + aiCurrent[AI_PTVS_VERTEX],
						pcMesh->mColors[p],
						pcMesh->mNumVertices * sizeof(aiColor4D));
				++p;
			}
			// now we need to copy all faces. since we will delete the source mesh afterwards,
			// we don't need to reallocate the array of indices except if this mesh is
			// referenced multiple times.
			for (unsigned int planck = 0; planck < pcMesh->mNumFaces; ++planck) {
				aiFace &f_src = pcMesh->mFaces[planck];
				aiFace &f_dst = pcMeshOut->mFaces[aiCurrent[AI_PTVS_FACE] + planck];

				const unsigned int num_idx = f_src.mNumIndices;

				f_dst.mNumIndices = num_idx;

				unsigned int *pi;
				if (!num_ref) { /* if last time the mesh is referenced -> no reallocation */
					pi = f_dst.mIndices = f_src.mIndices;

					// offset all vertex indices
					for (unsigned int hahn = 0; hahn < num_idx; ++hahn) {
						pi[hahn] += aiCurrent[AI_PTVS_VERTEX];
					}
				} else {
					pi = f_dst.mIndices = new unsigned int[num_idx];

					// copy and offset all vertex indices
					for (unsigned int hahn = 0; hahn < num_idx; ++hahn) {
						pi[hahn] = f_src.mIndices[hahn] + aiCurrent[AI_PTVS_VERTEX];
					}
				}

				// Update the mPrimitiveTypes member of the mesh
				switch (pcMesh->mFaces[planck].mNumIndices) {
					case 0x1:
						pcMeshOut->mPrimitiveTypes |= aiPrimitiveType_POINT;
						break;
					case 0x2:
						pcMeshOut->mPrimitiveTypes |= aiPrimitiveType_LINE;
						break;
					case 0x3:
						pcMeshOut->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
						break;
					default:
						pcMeshOut->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
						break;
				};
			}
			aiCurrent[AI_PTVS_VERTEX] += pcMesh->mNumVertices;
			aiCurrent[AI_PTVS_FACE] += pcMesh->mNumFaces;
		}
	}

	// append all children of us
	for (unsigned int i = 0; i < pcNode->mNumChildren; ++i) {
		CollectData(pcScene, pcNode->mChildren[i], iMat,
				iVFormat, pcMeshOut, aiCurrent, num_refs);
	}
}